

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O2

void __thiscall CppLogger::CppLogger::setFormat(CppLogger *this,Level t_Level,Format *t_Format)

{
  __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
  _Var1;
  _Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_70;
  _Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_58;
  _Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> local_40;
  
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
             &local_58,&t_Format->m_Format);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
             &local_70,&t_Format->m_Format);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<CppLogger::FormatAttribute*,std::vector<CppLogger::FormatAttribute,std::allocator<CppLogger::FormatAttribute>>>,__gnu_cxx::__ops::_Iter_equals_val<CppLogger::FormatAttribute_const>>
                    (local_58._M_impl.super__Vector_impl_data._M_start,
                     local_70._M_impl.super__Vector_impl_data._M_finish);
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::vector
            ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
             &local_40,&t_Format->m_Format);
  std::_Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
  ~_Vector_base(&local_40);
  std::_Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
  ~_Vector_base(&local_70);
  std::_Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
  ~_Vector_base(&local_58);
  if (_Var1._M_current == local_40._M_impl.super__Vector_impl_data._M_finish) {
    Format::addMessage(t_Format);
  }
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::operator=
            ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
             (&this->field_0x28 + (long)(int)(t_Level - Trace) * 0x18),&t_Format->m_Format);
  return;
}

Assistant:

void CppLogger::setFormat(Level t_Level, Format& t_Format) {
        if (std::find(t_Format.getFormat().begin(), t_Format.getFormat().end(), FormatAttribute::Message) == t_Format.getFormat().end()) {
            t_Format.addMessage();
        }
        m_Format[t_Level - 1] = t_Format;
    }